

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

PacketProtocolLayer *
ssh2_connection_new(Ssh *ssh,ssh_sharing_state *connshare,_Bool is_simple,Conf *conf,
                   char *peer_verstring,bufchain *user_input,ConnectionLayer **cl_out)

{
  _Bool _Var1;
  void *__s;
  Conf *pCVar2;
  char *pcVar3;
  tree234 *ptVar4;
  LogContext *pLVar5;
  PortFwdManager *pPVar6;
  ssh2_connection_state *s;
  bufchain *user_input_local;
  char *peer_verstring_local;
  Conf *conf_local;
  _Bool is_simple_local;
  ssh_sharing_state *connshare_local;
  Ssh *ssh_local;
  
  __s = safemalloc(1,0x150,0);
  memset(__s,0,0x150);
  *(PacketProtocolLayerVtable **)((long)__s + 0xe8) = &ssh2_connection_vtable;
  pCVar2 = conf_copy(conf);
  *(Conf **)((long)__s + 0x50) = pCVar2;
  *(_Bool *)((long)__s + 0x48) = is_simple;
  _Var1 = conf_get_bool(*(Conf **)((long)__s + 0x50),0x32);
  *(_Bool *)((long)__s + 0x49) = _Var1;
  *(ssh_sharing_state **)((long)__s + 8) = connshare;
  pcVar3 = dupstr(peer_verstring);
  *(char **)((long)__s + 0x10) = pcVar3;
  ptVar4 = newtree234(ssh2_channelcmp);
  *(tree234 **)((long)__s + 0x58) = ptVar4;
  ptVar4 = newtree234(x11_authcmp);
  *(tree234 **)((long)__s + 0x68) = ptVar4;
  *(bufchain **)((long)__s + 0x40) = user_input;
  *(ConnectionLayerVtable **)((long)__s + 0xe0) = &ssh2_connlayer_vtable;
  pLVar5 = ssh_get_logctx(ssh);
  *(LogContext **)((long)__s + 0xd8) = pLVar5;
  pPVar6 = portfwdmgr_new((ConnectionLayer *)((long)__s + 0xd8));
  *(PortFwdManager **)((long)__s + 0x80) = pPVar6;
  *cl_out = (ConnectionLayer *)((long)__s + 0xd8);
  if (*(long *)((long)__s + 8) != 0) {
    ssh_connshare_provide_connlayer
              (*(ssh_sharing_state **)((long)__s + 8),(ConnectionLayer *)((long)__s + 0xd8));
  }
  return (PacketProtocolLayer *)((long)__s + 0xe8);
}

Assistant:

PacketProtocolLayer *ssh2_connection_new(
    Ssh *ssh, ssh_sharing_state *connshare, bool is_simple,
    Conf *conf, const char *peer_verstring, bufchain *user_input,
    ConnectionLayer **cl_out)
{
    struct ssh2_connection_state *s = snew(struct ssh2_connection_state);
    memset(s, 0, sizeof(*s));
    s->ppl.vt = &ssh2_connection_vtable;

    s->conf = conf_copy(conf);

    s->ssh_is_simple = is_simple;

    /*
     * If the ssh_no_shell option is enabled, we disable the usual
     * termination check, so that we persist even in the absence of
     * any at all channels (because our purpose is probably to be a
     * background port forwarder).
     */
    s->persistent = conf_get_bool(s->conf, CONF_ssh_no_shell);

    s->connshare = connshare;
    s->peer_verstring = dupstr(peer_verstring);

    s->channels = newtree234(ssh2_channelcmp);

    s->x11authtree = newtree234(x11_authcmp);

    s->user_input = user_input;

    /* Need to get the log context for s->cl now, because we won't be
     * helpfully notified when a copy is written into s->ppl by our
     * owner. */
    s->cl.vt = &ssh2_connlayer_vtable;
    s->cl.logctx = ssh_get_logctx(ssh);

    s->portfwdmgr = portfwdmgr_new(&s->cl);

    *cl_out = &s->cl;
    if (s->connshare)
        ssh_connshare_provide_connlayer(s->connshare, &s->cl);

    return &s->ppl;
}